

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O0

BSSRDFProbeSegment * __thiscall
pbrt::TabulatedBSSRDF::Sample(TabulatedBSSRDF *this,Float u1,Point2f *u2)

{
  span<const_float> weights;
  int iVar1;
  float *pfVar2;
  Tuple2<pbrt::Point2,_float> *in_RDX;
  long in_RSI;
  BSSRDFProbeSegment *in_RDI;
  float in_XMM0_Da;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  Vector3<float> VVar16;
  Point3<float> PVar17;
  Point3f pTarget;
  Point3f pStart;
  Float l;
  Float rMax;
  Float phi;
  Float r;
  int ch;
  Vector3f vz;
  Vector3f vy;
  Vector3f vx;
  Normal3<float> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  initializer_list<float> in_stack_fffffffffffffdd8;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffde8;
  Tuple3<pbrt::Vector3,_float> *t;
  float s;
  Float *in_stack_fffffffffffffe28;
  Float in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  TabulatedBSSRDF *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe44;
  float in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined8 in_stack_fffffffffffffe70;
  int line;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined8 in_stack_fffffffffffffe80;
  LogLevel level;
  Tuple3<pbrt::Point3,_float> local_c0;
  float local_b0;
  Float local_ac;
  float local_a8;
  Float local_a4;
  float local_a0;
  int local_9c;
  int local_98;
  float local_94;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_84;
  undefined4 local_7c;
  Tuple3<pbrt::Vector3,_float> local_78;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 *local_60;
  undefined8 local_58;
  Tuple3<pbrt::Vector3,_float> local_3c;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_24;
  undefined4 local_1c;
  Tuple2<pbrt::Point2,_float> *local_18;
  float local_c;
  undefined1 auVar15 [56];
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  local_18 = in_RDX;
  local_c = in_XMM0_Da;
  Vector3<float>::Vector3((Vector3<float> *)0x827774);
  Vector3<float>::Vector3((Vector3<float> *)0x827781);
  Vector3<float>::Vector3((Vector3<float> *)0x82778e);
  local_6c = 0x3f000000;
  local_68 = 0x3e800000;
  local_64 = 0x3e800000;
  local_60 = &local_6c;
  local_58 = 3;
  pstd::span<const_float>::span
            ((span<const_float> *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdd8);
  weights._4_8_ = in_stack_fffffffffffffe44;
  weights.ptr._0_4_ = in_stack_fffffffffffffe40;
  weights.n._4_4_ = in_stack_fffffffffffffe4c;
  iVar1 = SampleDiscrete(weights,(Float)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                         (Float *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         in_stack_fffffffffffffe28);
  if (iVar1 == 0) {
    local_24 = *(undefined8 *)(in_RSI + 0x28);
    local_1c = *(undefined4 *)(in_RSI + 0x30);
    local_30 = *(undefined8 *)(in_RSI + 0x34);
    local_28 = *(undefined4 *)(in_RSI + 0x3c);
    Vector3<float>::Vector3<float>
              ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    local_3c.x = local_78.x;
    local_3c.y = local_78.y;
    local_3c.z = local_78.z;
  }
  else if (iVar1 == 1) {
    local_24 = *(undefined8 *)(in_RSI + 0x34);
    local_1c = *(undefined4 *)(in_RSI + 0x3c);
    Vector3<float>::Vector3<float>
              ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    local_30 = local_84;
    local_28 = local_7c;
    local_3c._0_8_ = *(undefined8 *)(in_RSI + 0x28);
    local_3c.z = *(float *)(in_RSI + 0x30);
  }
  else {
    if (iVar1 != 2) {
      LogFatal(level,(char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),line,
               (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    }
    Vector3<float>::Vector3<float>
              ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    local_24 = local_90;
    local_1c = local_88;
    local_30 = *(undefined8 *)(in_RSI + 0x28);
    local_28 = *(undefined4 *)(in_RSI + 0x30);
    local_3c._0_8_ = *(undefined8 *)(in_RSI + 0x34);
    local_3c.z = *(float *)(in_RSI + 0x3c);
  }
  local_98 = (int)(local_c * 4.0);
  local_9c = 3;
  pfVar2 = (float *)std::min<int>(&local_98,&local_9c);
  local_94 = *pfVar2;
  auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)local_c),
                           ZEXT416((uint)-(float)(int)local_94));
  local_a0 = auVar4._0_4_;
  pfVar2 = std::min<float>(&local_a0,(float *)&pbrt::OneMinusEpsilon);
  local_c = *pfVar2;
  s = local_94;
  Tuple2<pbrt::Point2,_float>::operator[](local_18,0);
  local_a4 = Sample_Sr(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30
                      );
  if (0.0 <= local_a4) {
    local_a8 = Tuple2<pbrt::Point2,_float>::operator[](local_18,1);
    local_a8 = local_a8 * 6.2831855;
    local_ac = Sample_Sr(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                         in_stack_fffffffffffffe30);
    if (local_a4 < local_ac) {
      auVar4 = vfmsub213ss_fma(ZEXT416((uint)local_ac),ZEXT416((uint)local_ac),
                               ZEXT416((uint)(local_a4 * local_a4)));
      dVar3 = std::sqrt(auVar4._0_8_);
      local_b0 = SUB84(dVar3,0) + SUB84(dVar3,0);
      std::cos((double)(ulong)(uint)local_a8);
      auVar15 = extraout_var;
      VVar16 = Tuple3<pbrt::Vector3,float>::operator*
                         ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffdd8._M_len,
                          in_stack_fffffffffffffdd8._M_array._4_4_);
      auVar5._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar5._8_56_ = auVar15;
      vmovlpd_avx(auVar5._0_16_);
      std::sin((double)(ulong)(uint)local_a8);
      auVar15 = extraout_var_00;
      VVar16 = Tuple3<pbrt::Vector3,float>::operator*
                         ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffdd8._M_len,
                          in_stack_fffffffffffffdd8._M_array._4_4_);
      auVar6._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar15;
      vmovlpd_avx(auVar6._0_16_);
      VVar16 = Tuple3<pbrt::Vector3,float>::operator+
                         ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffdd8._M_len,
                          (Vector3<float> *)in_stack_fffffffffffffdd8._M_array);
      auVar7._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar7._8_56_ = auVar15;
      auVar4 = auVar7._0_16_;
      auVar15 = (undefined1  [56])0x0;
      vmovlpd_avx(auVar4);
      VVar16 = pbrt::operator*(s,in_stack_fffffffffffffde8);
      auVar8._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar15;
      vmovlpd_avx(auVar8._0_16_);
      PVar17 = Point3<float>::operator+(auVar4._8_8_,auVar4._0_8_);
      auVar9._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar9._8_56_ = auVar15;
      vmovlpd_avx(auVar9._0_16_);
      auVar15 = (undefined1  [56])0x0;
      t = &local_3c;
      VVar16 = pbrt::operator*(s,t);
      auVar10._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar10._8_56_ = auVar15;
      vmovlpd_avx(auVar10._0_16_);
      auVar15 = (undefined1  [56])0x0;
      VVar16 = Tuple3<pbrt::Vector3,float>::operator*(auVar4._8_8_,auVar4._4_4_);
      auVar11._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar11._8_56_ = auVar15;
      vmovlpd_avx(auVar11._0_16_);
      PVar17 = Point3<float>::operator-(auVar4._8_8_,auVar4._0_8_);
      local_c0.z = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      auVar12._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar12._8_56_ = auVar15;
      local_c0._0_8_ = vmovlpd_avx(auVar12._0_16_);
      auVar15 = (undefined1  [56])0x0;
      VVar16 = pbrt::operator*(s,t);
      auVar13._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar15;
      vmovlpd_avx(auVar13._0_16_);
      PVar17 = Point3<float>::operator+(auVar4._8_8_,auVar4._0_8_);
      auVar14._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar14._8_56_ = auVar15;
      vmovlpd_avx(auVar14._0_16_);
      BSSRDFProbeSegment::BSSRDFProbeSegment
                (in_RDI,(Point3f *)&local_c0,(Point3f *)&stack0xfffffffffffffe44,
                 *(Float *)(in_RSI + 0x18));
    }
    else {
      memset(in_RDI,0,0x20);
      BSSRDFProbeSegment::BSSRDFProbeSegment
                ((BSSRDFProbeSegment *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                );
    }
  }
  else {
    memset(in_RDI,0,0x20);
    BSSRDFProbeSegment::BSSRDFProbeSegment
              ((BSSRDFProbeSegment *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    BSSRDFProbeSegment Sample(Float u1, const Point2f &u2) const {
        // Choose projection axis for BSSRDF sampling
        Vector3f vx, vy, vz;
        switch (SampleDiscrete({0.5, .25, .25}, u1, nullptr, &u1)) {
        case 0:
            vx = ss;
            vy = ts;
            vz = Vector3f(ns);
            break;
        case 1:
            // Prepare for sampling rays with respect to _ss_
            vx = ts;
            vy = Vector3f(ns);
            vz = ss;
            break;

        case 2:
            // Prepare for sampling rays with respect to _ts_
            vx = Vector3f(ns);
            vy = ss;
            vz = ts;
            break;

        default:
            LOG_FATAL("Unexpected value returned from SampleDiscrete");
        }

        // Choose spectral channel for BSSRDF sampling
        int ch = std::min<int>(u1 * NSpectrumSamples, NSpectrumSamples - 1);
        u1 = std::min(u1 * NSpectrumSamples - ch, OneMinusEpsilon);

        // Sample BSSRDF profile in polar coordinates
        Float r = Sample_Sr(ch, u2[0]);
        if (r < 0)
            return {};
        Float phi = 2 * Pi * u2[1];

        // Compute BSSRDF profile bounds and intersection height
        Float rMax = Sample_Sr(ch, 0.999f);
        if (r >= rMax)
            return {};
        Float l = 2 * std::sqrt(rMax * rMax - r * r);

        // Return BSSRDF sampling ray segment
        Point3f pStart =
            po + r * (vx * std::cos(phi) + vy * std::sin(phi)) - l * vz * 0.5f;
        Point3f pTarget = pStart + l * vz;
        return BSSRDFProbeSegment{pStart, pTarget, time};
    }